

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O3

void __thiscall
boost::detail::shared_count::shared_count<boost::detail::thread_data_base>
          (shared_count *this,thread_data_base *p)

{
  sp_counted_base *psVar1;
  
  this->pi_ = (sp_counted_base *)0x0;
  psVar1 = (sp_counted_base *)operator_new(0x18);
  psVar1->use_count_ = 1;
  psVar1->weak_count_ = 1;
  psVar1->_vptr_sp_counted_base = (_func_int **)&PTR__sp_counted_base_001ccb28;
  psVar1[1]._vptr_sp_counted_base = (_func_int **)p;
  this->pi_ = psVar1;
  return;
}

Assistant:

explicit shared_count( Y * p ): pi_( 0 )
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        , id_(shared_count_id)
#endif
    {
#ifndef BOOST_NO_EXCEPTIONS

        try
        {
            pi_ = new sp_counted_impl_p<Y>( p );
        }
        catch(...)
        {
            boost::checked_delete( p );
            throw;
        }

#else

        pi_ = new sp_counted_impl_p<Y>( p );

        if( pi_ == 0 )
        {
            boost::checked_delete( p );
            boost::throw_exception( std::bad_alloc() );
        }

#endif
    }